

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O3

QByteArray * escapedString(QByteArray *__return_storage_ptr__,QStringView s)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  storage_type_conflict sVar3;
  Data *pDVar4;
  char cVar5;
  byte *pbVar6;
  char *pcVar7;
  char *pcVar8;
  QByteArray *extraout_RAX;
  byte *pbVar9;
  storage_type_conflict *psVar10;
  byte bVar11;
  long lVar12;
  qsizetype size;
  byte bVar13;
  ushort uVar14;
  uint uVar15;
  P _a;
  char *pcVar16;
  storage_type_conflict *psVar17;
  
  lVar12 = s.m_size;
  size = 0x10;
  if (0x10 < lVar12) {
    size = lVar12;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
  pcVar8 = (__return_storage_ptr__->d).ptr;
  pcVar16 = pcVar8;
  if ((byte *)pcVar8 == (byte *)0x0) {
    pcVar16 = &QByteArray::_empty;
  }
  if (lVar12 != 0) {
    psVar1 = s.m_data + lVar12;
    pbVar6 = (byte *)pcVar16 + (__return_storage_ptr__->d).size;
    pbVar9 = (byte *)pcVar16;
    psVar17 = s.m_data;
    do {
      if (pbVar6 + -6 <= pbVar9) {
        pcVar16 = (__return_storage_ptr__->d).ptr;
        if (pcVar16 == (char *)0x0) {
          pcVar16 = &QByteArray::_empty;
        }
        QByteArray::resize(__return_storage_ptr__,(__return_storage_ptr__->d).size * 2);
        pDVar4 = (__return_storage_ptr__->d).d;
        if ((pDVar4 == (Data *)0x0) ||
           (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
        }
        pcVar8 = (__return_storage_ptr__->d).ptr;
        pcVar7 = pcVar8;
        if (pcVar8 == (char *)0x0) {
          pcVar7 = &QByteArray::_empty;
        }
        pbVar9 = (byte *)(pcVar8 + ((long)pbVar9 - (long)pcVar16));
        pbVar6 = (byte *)(pcVar7 + (__return_storage_ptr__->d).size);
      }
      psVar10 = psVar17 + 1;
      sVar2 = *psVar17;
      uVar15 = (uint)(ushort)sVar2;
      if ((ushort)sVar2 < 0x80) {
        if ((((ushort)sVar2 < 0x20) || (sVar2 == L'\\')) || (uVar15 == 0x22)) {
          *pbVar9 = 0x5c;
          pcVar16 = (char *)(pbVar9 + 2);
          switch(uVar15) {
          case 8:
            pbVar9[1] = 0x62;
            break;
          case 9:
            pbVar9[1] = 0x74;
            break;
          case 10:
            pbVar9[1] = 0x6e;
            break;
          case 0xb:
switchD_002f962a_caseD_b:
            pbVar9[1] = 0x75;
            pbVar9[2] = 0x30;
            pbVar9[3] = 0x30;
            cVar5 = (char)(uVar15 & 0xf);
            bVar11 = cVar5 + 0x57;
            if ((uVar15 & 0xf) < 10) {
              bVar11 = cVar5 + 0x30;
            }
            pbVar9[4] = (byte)((ushort)sVar2 >> 4) | 0x30;
            pbVar9[5] = bVar11;
LAB_002f97c3:
            pcVar16 = (char *)(pbVar9 + 6);
            break;
          case 0xc:
            pbVar9[1] = 0x66;
            break;
          case 0xd:
            pbVar9[1] = 0x72;
            break;
          default:
            if (uVar15 == 0x5c) {
              pbVar9[1] = 0x5c;
            }
            else {
              if (uVar15 != 0x22) goto switchD_002f962a_caseD_b;
              pbVar9[1] = 0x22;
            }
          }
        }
        else {
          *pbVar9 = (byte)sVar2;
          pcVar16 = (char *)(pbVar9 + 1);
        }
      }
      else {
        if (uVar15 < 0x800) {
          bVar11 = (byte)((ushort)sVar2 >> 6) | 0xc0;
        }
        else {
          if ((uVar15 & 0xf800) == 0xd800) {
            if (((uVar15 & 0xdc00) != 0xd800 || psVar10 == psVar1) ||
               (sVar3 = *psVar10, ((ushort)sVar3 & 0xfc00) != 0xdc00)) {
              pbVar9[0] = 0x5c;
              pbVar9[1] = 0x75;
              uVar14 = (ushort)sVar2 >> 8 & 0xf;
              cVar5 = (char)uVar14;
              bVar11 = cVar5 + 0x57;
              if (uVar14 < 10) {
                bVar11 = cVar5 + 0x30;
              }
              pbVar9[2] = 100;
              pbVar9[3] = bVar11;
              uVar14 = (ushort)sVar2 >> 4 & 0xf;
              cVar5 = (char)uVar14;
              bVar11 = cVar5 + 0x57;
              if (uVar14 < 10) {
                bVar11 = cVar5 + 0x30;
              }
              cVar5 = (char)(uVar15 & 0xf);
              bVar13 = cVar5 + 0x57;
              if ((uVar15 & 0xf) < 10) {
                bVar13 = cVar5 + 0x30;
              }
              pbVar9[4] = bVar11;
              pbVar9[5] = bVar13;
              goto LAB_002f97c3;
            }
            psVar10 = psVar17 + 2;
            uVar15 = (uint)(ushort)sVar3 + uVar15 * 0x400 + 0xfca02400;
            *pbVar9 = (byte)(uVar15 >> 0x12) | 0xf0;
            pbVar9[1] = (byte)(uVar15 >> 0xc) & 0x3f | 0x80;
            pbVar9 = pbVar9 + 2;
          }
          else {
            *pbVar9 = (byte)((ushort)sVar2 >> 0xc) | 0xe0;
            pbVar9 = pbVar9 + 1;
          }
          bVar11 = (byte)(uVar15 >> 6) & 0x3f | 0x80;
        }
        *pbVar9 = bVar11;
        pbVar9[1] = (byte)uVar15 & 0x3f | 0x80;
        pcVar16 = (char *)(pbVar9 + 2);
      }
      pbVar9 = (byte *)pcVar16;
      psVar17 = psVar10;
    } while (psVar10 != psVar1);
    pcVar8 = (__return_storage_ptr__->d).ptr;
  }
  if ((byte *)pcVar8 == (byte *)0x0) {
    pcVar8 = &QByteArray::_empty;
  }
  QByteArray::resize(__return_storage_ptr__,(long)pcVar16 - (long)pcVar8);
  return extraout_RAX;
}

Assistant:

static QByteArray escapedString(QStringView s)
{
    // give it a minimum size to ensure the resize() below always adds enough space
    QByteArray ba(qMax(s.size(), 16), Qt::Uninitialized);

    auto ba_const_start = [&]() { return reinterpret_cast<const uchar *>(ba.constData()); };
    uchar *cursor = reinterpret_cast<uchar *>(const_cast<char *>(ba.constData()));
    const uchar *ba_end = cursor + ba.size();
    const char16_t *src = s.utf16();
    const char16_t *const end = s.utf16() + s.size();

    while (src != end) {
        if (cursor >= ba_end - 6) {
            // ensure we have enough space
            qptrdiff pos = cursor - ba_const_start();
            ba.resize(ba.size()*2);
            cursor = reinterpret_cast<uchar *>(ba.data()) + pos;
            ba_end = ba_const_start() + ba.size();
        }

        char16_t u = *src++;
        if (u < 0x80) {
            if (u < 0x20 || u == 0x22 || u == 0x5c) {
                *cursor++ = '\\';
                switch (u) {
                case 0x22:
                    *cursor++ = '"';
                    break;
                case 0x5c:
                    *cursor++ = '\\';
                    break;
                case 0x8:
                    *cursor++ = 'b';
                    break;
                case 0xc:
                    *cursor++ = 'f';
                    break;
                case 0xa:
                    *cursor++ = 'n';
                    break;
                case 0xd:
                    *cursor++ = 'r';
                    break;
                case 0x9:
                    *cursor++ = 't';
                    break;
                default:
                    *cursor++ = 'u';
                    *cursor++ = '0';
                    *cursor++ = '0';
                    *cursor++ = hexdig(u>>4);
                    *cursor++ = hexdig(u & 0xf);
               }
            } else {
                *cursor++ = (uchar)u;
            }
        } else if (QUtf8Functions::toUtf8<QUtf8BaseTraits>(u, cursor, src, end) < 0) {
            // failed to get valid utf8 use JSON escape sequence
            *cursor++ = '\\';
            *cursor++ = 'u';
            *cursor++ = hexdig(u>>12 & 0x0f);
            *cursor++ = hexdig(u>>8 & 0x0f);
            *cursor++ = hexdig(u>>4 & 0x0f);
            *cursor++ = hexdig(u & 0x0f);
        }
    }

    ba.resize(cursor - ba_const_start());
    return ba;
}